

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Option *pOVar1;
  ostream *poVar2;
  int argc_00;
  string *option_description;
  char **argv_00;
  vector<cv::Mat,_std::allocator<cv::Mat>_> image_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  image_path;
  arguments args;
  App app;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_7d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7b8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_7a0;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  arguments local_4a8;
  arguments local_428;
  arguments local_3a8;
  App local_328;
  
  arguments::arguments(&local_4a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,"CLI to create timelapse video",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"",(allocator<char> *)&local_7d8);
  CLI::App::App(&local_328,&local_4c8,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"-s,--source",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"source directory containing frames",(allocator<char> *)&local_7d8
            );
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&local_328,&local_508,&local_4a8.source_dir,&local_528,false);
  (pOVar1->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"-o, --output",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"output file name [default: output.avi]",
             (allocator<char> *)&local_7d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_328,&local_548,&local_4a8.output_file_name,&local_568,false);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"-f,--frames",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"frames for making video [default: 25]",
             (allocator<char> *)&local_7d8);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (&local_328,&local_588,&local_4a8.frames,&local_5a8,false);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"-z,--filter",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"Name to filter to be applied to each frame",
             (allocator<char> *)&local_7d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (&local_328,&local_5c8,&local_4a8.filter_name,&local_5e8,false);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"-v,--value",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"Value of the filter provided in -z/--filter option",
             (allocator<char> *)&local_7d8);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (&local_328,&local_608,&local_4a8.filter_value,&local_628,false);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"-B,--brightness",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"Value of brightness to applied to images [default: 0]",
             (allocator<char> *)&local_7d8);
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_328,&local_648,&local_4a8.brightness_value,&local_668,false);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"-S,--sharpness",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"Value of sharpness to be applied to the images [default: 1]",
             (allocator<char> *)&local_7d8);
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_328,&local_688,&local_4a8.sharpness_value,&local_6a8,false);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"-L,--blur",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"Value of blur to be applied to the images [defauly: 1]",
             (allocator<char> *)&local_7d8);
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_328,&local_6c8,&local_4a8.blur_value,&local_6e8,false);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"-T,--contrast",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Value of Contrast to be applied to the images [default: 1]",
             (allocator<char> *)&local_7d8);
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_328,&local_708,&local_4a8.contrast_value,&local_728,false);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"-I,--saturation",(allocator<char> *)&local_7b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"Value of saturation to be applied to the images [default: 1]",
             (allocator<char> *)&local_7d8);
  option_description = &local_768;
  CLI::App::add_option<float,_float,_(CLI::detail::enabler)0>
            (&local_328,&local_748,&local_4a8.saturation_value,option_description,false);
  argc_00 = (int)option_description;
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  CLI::App::parse(&local_328,argc,argv);
  std::operator<<((ostream *)&std::cout,(string *)&banner_abi_cxx11_);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7d8.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_788,(string *)&local_4a8);
  read_images(&local_788,&local_7d8);
  std::__cxx11::string::~string((string *)&local_788);
  arguments::arguments(&local_3a8,&local_4a8);
  apply_filter(&local_7d8,&local_3a8,argv_00,argc_00);
  arguments::~arguments(&local_3a8);
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_7a0,&local_7d8);
  arguments::arguments(&local_428,&local_4a8);
  make_timelapse(&local_7a0,&local_428);
  arguments::~arguments(&local_428);
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_7a0);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)color::green_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"\nFinished : Timelapse Ready");
  poVar2 = std::operator<<(poVar2,(string *)color::reset_abi_cxx11_);
  std::endl<char,std::char_traits<char>>(poVar2);
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_7d8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_7b8);
  CLI::App::~App(&local_328);
  arguments::~arguments(&local_4a8);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   // CLI logic
   arguments args;
   CLI::App app{"CLI to create timelapse video"};
   // CLI options
   app.add_option("-s,--source", args.source_dir, "source directory containing frames")->required();
   app.add_option("-o, --output", args.output_file_name, "output file name [default: output.avi]");
   app.add_option("-f,--frames", args.frames, "frames for making video [default: 25]");
   app.add_option("-z,--filter", args.filter_name, "Name to filter to be applied to each frame");
   app.add_option("-v,--value", args.filter_value, "Value of the filter provided in -z/--filter option");
   app.add_option("-B,--brightness", args.brightness_value, "Value of brightness to applied to images [default: 0]");
   app.add_option("-S,--sharpness",args.sharpness_value, "Value of sharpness to be applied to the images [default: 1]");
   app.add_option("-L,--blur", args.blur_value, "Value of blur to be applied to the images [defauly: 1]");
   app.add_option("-T,--contrast", args.contrast_value, "Value of Contrast to be applied to the images [default: 1]");
   app.add_option("-I,--saturation", args.saturation_value, "Value of saturation to be applied to the images [default: 1]");
   CLI11_PARSE(app, argc, argv);
   std::cout << banner;
   std::cout << endl;

   // application logic
   std::vector<std::string> image_path;
   std::vector<cv::Mat> image_list;

   //read image in a vector
   read_images(args.source_dir, image_list);
   // apply filter parameter
   apply_filter(image_list, args, argv, argc);
   // convert collected image to video
   make_timelapse(image_list, args);

   cout << color::green << "\nFinished : Timelapse Ready" << color::reset << std::endl;

   return 0;
}